

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O3

void __thiscall
HalosExchange::HalosExchange
          (HalosExchange *this,int rank,int n_processes,int n_partners,int message_size)

{
  int iVar1;
  int *partners;
  ostream *poVar2;
  double **ppdVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  
  (this->super_Computation)._vptr_Computation = (_func_int **)&PTR__HalosExchange_00108c38;
  this->sbuf = (double *)0x0;
  this->reqs = (MPI_Request *)0x0;
  this->rank = rank;
  this->n_partners = n_partners;
  uVar5 = 0xffffffffffffffff;
  if (-1 < n_partners) {
    uVar5 = (long)n_partners * 4;
  }
  partners = (int *)operator_new__(uVar5);
  this->partners = partners;
  iVar1 = find_partners(rank,n_processes,n_partners,partners);
  if (iVar1 != 0) {
    MPI_Abort(&ompi_mpi_comm_world,1);
  }
  if ((message_size & 7U) != 0) {
    if (rank == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Message size must be a multiple of ",0x23);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    }
    MPI_Abort(&ompi_mpi_comm_world,1);
  }
  uVar5 = (long)n_partners * 8;
  iVar1 = message_size + 7;
  if (-1 < message_size) {
    iVar1 = message_size;
  }
  if (n_partners < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  this->n_elements = iVar1 >> 3;
  ppdVar3 = (double **)operator_new__(uVar5);
  this->rbuf = ppdVar3;
  if (0 < n_partners) {
    uVar5 = (ulong)(uint)(iVar1 >> 3) << 3;
    if (message_size < -7) {
      uVar5 = 0xffffffffffffffff;
    }
    uVar6 = 0;
    do {
      pdVar4 = (double *)operator_new__(uVar5);
      this->rbuf[uVar6] = pdVar4;
      uVar6 = uVar6 + 1;
    } while ((uint)n_partners != uVar6);
  }
  return;
}

Assistant:

HalosExchange(int rank, int n_processes, int n_partners, int message_size)
    {
        this->rank = rank;
        this->n_partners = n_partners;
        this->partners = new int[n_partners];
        int failed = find_partners(rank, n_processes, n_partners, partners);
        if (failed) MPI_Abort(MPI_COMM_WORLD, 1);
        int sod = sizeof(double);
        if (message_size % sod != 0)
        {
            if (rank == 0)
                std::cerr << "Message size must be a multiple of " << sod << "\n";
            MPI_Abort(MPI_COMM_WORLD, 1);
        }
        this->n_elements = message_size / sod;
        this->rbuf = new double*[n_partners];
        for (int i = 0; i < n_partners; i++)
            rbuf[i] = new double[n_elements];
    }